

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

int lsrkStep_AccessStepMem(ARKodeMem ark_mem,char *fname,ARKodeLSRKStepMem *step_mem)

{
  undefined8 *in_RDX;
  char *in_RSI;
  ARKodeMem in_RDI;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x869,in_RSI,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    *in_RDX = in_RDI->step_mem;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int lsrkStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                           ARKodeLSRKStepMem* step_mem)
{
  /* access ARKodeLSRKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LSRKSTEP_NO_MEM);
    return ARK_MEM_NULL;
  }
  *step_mem = (ARKodeLSRKStepMem)ark_mem->step_mem;
  return ARK_SUCCESS;
}